

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int fmustach(char *template,mustach_itf *itf,void *closure,FILE *file)

{
  long lVar1;
  long in_FS_OFFSET;
  int local_38;
  int local_34;
  int rc;
  FILE *file_local;
  void *closure_local;
  mustach_itf *itf_local;
  char *template_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (itf->start == (_func_int_void_ptr *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (*itf->start)(closure);
  }
  local_34 = local_38;
  if (local_38 == 0) {
    local_34 = process(template,itf,closure,file,"{{","}}");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

int fmustach(const char *template, struct mustach_itf *itf, void *closure, FILE *file)
{
	int rc = itf->start ? itf->start(closure) : 0;
	if (rc == 0)
		rc = process(template, itf, closure, file, "{{", "}}");
	return rc;
}